

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.c
# Opt level: O0

void rmf_fileInfo_copy_base_name(rmf_fileInfo_t *self,char *dest,uint32_t max_dest_len)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  uint32_t len;
  char *dot;
  char *name;
  uint32_t max_dest_len_local;
  char *dest_local;
  rmf_fileInfo_t *self_local;
  
  if ((self != (rmf_fileInfo_t *)0x0) && (1 < max_dest_len)) {
    __s = adt_str_cstr(&self->name);
    pcVar2 = strchr(__s,0x2e);
    if (pcVar2 != (char *)0x0) {
      uVar1 = (int)pcVar2 - (int)__s;
      if (max_dest_len < uVar1) {
        strncpy(dest,__s,(ulong)(max_dest_len - 1));
        dest[max_dest_len - 1] = '\0';
      }
      else {
        strncpy(dest,__s,(ulong)uVar1);
        dest[uVar1] = '\0';
      }
    }
  }
  return;
}

Assistant:

void rmf_fileInfo_copy_base_name(rmf_fileInfo_t const* self, char* dest, uint32_t max_dest_len)
{
   if ( (self != NULL) && (max_dest_len > 1))
   {
      char const* name = adt_str_cstr((adt_str_t*)&self->name);
      char *dot = strchr(name, '.');
      if (dot != 0)
      {
         uint32_t len = (uint32_t) (dot - name);
         if (max_dest_len < len)
         {
            strncpy(dest, name, max_dest_len -1);
            dest[max_dest_len -1] = '\0';
         }
         else
         {
            strncpy(dest, name, len);
            dest[len] = '\0';
         }
      }
   }
}